

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

void __thiscall antlr::BitSet::BitSet(BitSet *this,uint nbits)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  uint in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  reference rVar1;
  uint i;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<bool,_std::allocator<bool>_> *__n;
  reference local_30;
  uint local_20;
  uint local_c;
  
  this_00 = (vector<bool,_std::allocator<bool>_> *)(ulong)in_ESI;
  __n = in_RDI;
  local_c = in_ESI;
  std::allocator<bool>::allocator((allocator<bool> *)0x2dacd4);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<bool>::~allocator((allocator<bool> *)0x2dacf4);
  for (local_20 = 0; local_20 < local_c; local_20 = local_20 + 1) {
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
    local_30 = rVar1;
    std::_Bit_reference::operator=(&local_30,false);
  }
  return;
}

Assistant:

BitSet::BitSet(unsigned int nbits)
: storage(nbits)
{
	for (unsigned int i = 0; i < nbits ; i++ )
		storage[i] = false;
}